

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_Js::FrameDisplay_*>::Unload
          (TTDIdentifierDictionary<unsigned_long,_Js::FrameDisplay_*> *this)

{
  TTDIdentifierDictionary<unsigned_long,_Js::FrameDisplay_*> *this_local;
  
  if (this->m_hashArray != (Entry *)0x0) {
    Memory::
    DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,Js::FrameDisplay*>::Entry>
              (&Memory::HeapAllocator::Instance,(ulong)this->m_capacity,this->m_hashArray);
    this->m_hashArray = (Entry *)0x0;
    this->m_capacity = 0;
    this->m_count = 0;
    this->m_h1Prime = 0;
    this->m_h2Prime = 0;
  }
  return;
}

Assistant:

void Unload()
        {
            if (this->m_hashArray != nullptr)
            {
                TT_HEAP_FREE_ARRAY(Entry, this->m_hashArray, this->m_capacity);
                this->m_hashArray = nullptr;
                this->m_capacity = 0;

                this->m_count = 0;

                this->m_h1Prime = 0;
                this->m_h2Prime = 0;
            }
        }